

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_Matching_Unknown_Test::TestBody
          (ComparisonTest_Matching_Unknown_Test *this)

{
  bool bVar1;
  UnknownFieldSet *pUVar2;
  char *message;
  AssertHelper local_70;
  Message local_68 [3];
  string local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  ComparisonTest_Matching_Unknown_Test *this_local;
  
  pUVar2 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown1_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,1);
  pUVar2 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,1);
  pUVar2 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown1_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,3);
  pUVar2 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,3);
  pUVar2 = (this->super_ComparisonTest).unknown2_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"cat");
  UnknownFieldSet::AddLengthDelimited(pUVar2,0xf2,stack0xffffffffffffffe0);
  pUVar2 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf6);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,4);
  protobuf::(anonymous_namespace)::ComparisonTest::RunUn_abi_cxx11_(&local_50,this);
  testing::internal::EqHelper::
  Compare<char[45],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_30,"\"added: 242[0]: \\\"cat\\\"\\n\" \"added: 246[0]: { ... }\\n\"",
             "RunUn()",(char (*) [45])"added: 242[0]: \"cat\"\nadded: 246[0]: { ... }\n",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xd27,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST_F(ComparisonTest, Matching_Unknown) {
  unknown1_->AddGroup(245)->AddFixed32(248, 1);
  unknown2_->AddGroup(245)->AddFixed32(248, 1);
  unknown1_->AddGroup(245)->AddFixed32(248, 3);
  unknown2_->AddGroup(245)->AddFixed32(248, 3);
  unknown2_->AddLengthDelimited(242, "cat");
  unknown2_->AddGroup(246)->AddFixed32(248, 4);

  // report_match is false so only added/modified fields are expected.
  EXPECT_EQ(
      "added: 242[0]: \"cat\"\n"
      "added: 246[0]: { ... }\n",
      RunUn());
}